

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

ssize_t ws_cw_dec_next(uchar *buf,size_t buflen,int frame_age,int frame_flags,
                      curl_off_t payload_offset,curl_off_t payload_len,void *user_data,CURLcode *err
                      )

{
  CURLcode CVar1;
  size_t local_60;
  size_t bytes;
  curl_off_t remain;
  websocket *ws;
  Curl_easy *data;
  ws_cw_dec_ctx *ctx;
  curl_off_t payload_len_local;
  curl_off_t payload_offset_local;
  int frame_flags_local;
  int frame_age_local;
  size_t buflen_local;
  uchar *buf_local;
  
  data = (Curl_easy *)user_data;
  ws = *user_data;
  remain = *(undefined8 *)((long)user_data + 8);
  bytes = payload_len - (payload_offset + buflen);
  ctx = (ws_cw_dec_ctx *)payload_len;
  payload_len_local = payload_offset;
  payload_offset_local._0_4_ = frame_flags;
  payload_offset_local._4_4_ = frame_age;
  _frame_flags_local = buflen;
  buflen_local = (size_t)buf;
  if (((frame_flags & 0x10U) == 0) || (bytes != 0)) {
    if ((buflen != 0) || (bytes == 0)) {
      update_meta((websocket *)remain,frame_age,frame_flags,payload_offset,payload_len,buflen);
      CVar1 = Curl_cwriter_write((Curl_easy *)ws,(Curl_cwriter *)data->mid,*(int *)&data->conn,
                                 (char *)buflen_local,_frame_flags_local);
      *err = CVar1;
      if (*err != CURLE_OK) {
        return -1;
      }
    }
  }
  else {
    if ((((Curl_easy *)ws != (Curl_easy *)0x0) &&
        ((*(ulong *)&(((Curl_easy *)ws)->set).field_0x894 >> 0x1e & 1) != 0)) &&
       (((((Curl_easy *)ws)->state).feat == (curl_trc_feat *)0x0 ||
        (0 < ((((Curl_easy *)ws)->state).feat)->log_level)))) {
      Curl_infof((Curl_easy *)ws,"WS: auto-respond to PING with a PONG");
    }
    CVar1 = curl_ws_send(ws,(void *)buflen_local,_frame_flags_local,&local_60,0,0x40);
    *err = CVar1;
    if (*err != CURLE_OK) {
      return -1;
    }
  }
  *err = CURLE_OK;
  return _frame_flags_local;
}

Assistant:

static ssize_t ws_cw_dec_next(const unsigned char *buf, size_t buflen,
                              int frame_age, int frame_flags,
                              curl_off_t payload_offset,
                              curl_off_t payload_len,
                              void *user_data,
                              CURLcode *err)
{
  struct ws_cw_dec_ctx *ctx = user_data;
  struct Curl_easy *data = ctx->data;
  struct websocket *ws = ctx->ws;
  curl_off_t remain = (payload_len - (payload_offset + buflen));

  (void)frame_age;
  if((frame_flags & CURLWS_PING) && !remain) {
    /* auto-respond to PINGs, only works for single-frame payloads atm */
    size_t bytes;
    infof(data, "WS: auto-respond to PING with a PONG");
    /* send back the exact same content as a PONG */
    *err = curl_ws_send(data, buf, buflen, &bytes, 0, CURLWS_PONG);
    if(*err)
      return -1;
  }
  else if(buflen || !remain) {
    /* forward the decoded frame to the next client writer. */
    update_meta(ws, frame_age, frame_flags, payload_offset,
                payload_len, buflen);

    *err = Curl_cwriter_write(data, ctx->next_writer, ctx->cw_type,
                              (const char *)buf, buflen);
    if(*err)
      return -1;
  }
  *err = CURLE_OK;
  return (ssize_t)buflen;
}